

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall
DependencyScan::RecomputeDirty
          (DependencyScan *this,Node *node,vector<Node_*,_std::allocator<Node_*>_> *stack,
          string *err)

{
  pointer *pppNVar1;
  Edge *edge;
  iterator __position;
  Edge *pEVar2;
  pointer ppNVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  undefined4 extraout_var_00;
  pointer ppNVar8;
  pointer ppNVar9;
  Node *pNVar10;
  pointer ppNVar11;
  string *in_R8;
  Node *pNVar12;
  bool local_49;
  DependencyScan *local_48;
  vector<Node_*,_std::allocator<Node_*>_> *local_40;
  Node *local_38;
  undefined4 extraout_var;
  
  edge = node->in_edge_;
  local_48 = this;
  local_38 = node;
  if (edge == (Edge *)0x0) {
    if (node->mtime_ != -1) {
      return true;
    }
    iVar6 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[3])
                      (this->disk_interface_,node,err);
    lVar7 = CONCAT44(extraout_var,iVar6);
    node->mtime_ = lVar7;
    bVar4 = false;
    if (lVar7 == -1) {
      return false;
    }
    if ((lVar7 == 0) && (bVar4 = true, g_explaining == true)) {
      fprintf(_stderr,"ninja explain: %s has no in-edge and is missing\n",
              (node->path_)._M_dataplus._M_p);
      bVar4 = node->mtime_ == 0;
    }
    node->dirty_ = bVar4;
    return true;
  }
  if (edge->mark_ == VisitDone) {
    return true;
  }
  bVar4 = VerifyDAG(this,node,stack,err);
  if (!bVar4) {
    return false;
  }
  edge->mark_ = VisitInStack;
  __position._M_current =
       (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)stack,__position,&local_38);
  }
  else {
    *__position._M_current = node;
    pppNVar1 = &(stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  edge->outputs_ready_ = true;
  edge->deps_missing_ = false;
  if (((edge->deps_loaded_ == false) && (pNVar10 = edge->dyndep_, pNVar10 != (Node *)0x0)) &&
     (pNVar10->dyndep_pending_ == true)) {
    bVar4 = RecomputeDirty(local_48,pNVar10,stack,err);
    if (!bVar4) {
      return false;
    }
    pEVar2 = edge->dyndep_->in_edge_;
    if (((pEVar2 == (Edge *)0x0) || (pEVar2->outputs_ready_ == true)) &&
       (bVar4 = DyndepLoader::LoadDyndeps(&local_48->dyndep_loader_,edge->dyndep_,err), !bVar4)) {
      return false;
    }
  }
  ppNVar8 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar11 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppNVar11 != ppNVar8; ppNVar11 = ppNVar11 + 1) {
    pNVar10 = *ppNVar11;
    if (pNVar10->mtime_ == -1) {
      iVar6 = (*(local_48->disk_interface_->super_FileReader)._vptr_FileReader[3])
                        (local_48->disk_interface_,pNVar10,err);
      pNVar10->mtime_ = CONCAT44(extraout_var_00,iVar6);
      if (CONCAT44(extraout_var_00,iVar6) == -1) {
        return false;
      }
      ppNVar8 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  if (edge->deps_loaded_ == false) {
    edge->deps_loaded_ = true;
    bVar4 = ImplicitDepLoader::LoadDeps(&local_48->dep_loader_,edge,err);
    if (!bVar4) {
      if (err->_M_string_length != 0) {
        return false;
      }
      edge->deps_missing_ = true;
      bVar4 = true;
      goto LAB_00187c64;
    }
  }
  bVar4 = false;
LAB_00187c64:
  ppNVar11 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = stack;
  if (ppNVar11 ==
      (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar10 = (Node *)0x0;
  }
  else {
    ppNVar8 = ppNVar11;
    pNVar12 = (Node *)0x0;
    do {
      bVar5 = RecomputeDirty(local_48,*ppNVar8,local_40,err);
      if (!bVar5) {
        return false;
      }
      pNVar10 = *ppNVar8;
      if ((pNVar10->in_edge_ != (Edge *)0x0) && (pNVar10->in_edge_->outputs_ready_ == false)) {
        edge->outputs_ready_ = false;
      }
      ppNVar3 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar9 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppNVar11 - (long)ppNVar3 >> 3) <
          (ulong)(((long)ppNVar9 - (long)ppNVar3 >> 3) - (long)edge->order_only_deps_)) {
        if (pNVar10->dirty_ == true) {
          bVar4 = true;
          if (g_explaining == true) {
            fprintf(_stderr,"ninja explain: %s is dirty\n",(pNVar10->path_)._M_dataplus._M_p);
            ppNVar9 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          goto LAB_00187d20;
        }
        if ((pNVar12 != (Node *)0x0) && (pNVar10->mtime_ <= pNVar12->mtime_)) goto LAB_00187d20;
      }
      else {
LAB_00187d20:
        pNVar10 = pNVar12;
      }
      ppNVar8 = ppNVar8 + 1;
      ppNVar11 = ppNVar11 + 1;
      pNVar12 = pNVar10;
    } while (ppNVar8 != ppNVar9);
  }
  local_49 = bVar4;
  if (bVar4 == false) {
    RecomputeOutputsDirty(local_48,edge,pNVar10,&local_49,in_R8);
  }
  ppNVar8 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar11 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppNVar11 != ppNVar8; ppNVar11 = ppNVar11 + 1) {
    if ((local_49 & 1U) != 0) {
      (*ppNVar11)->dirty_ = true;
    }
  }
  if (((local_49 & 1U) != 0) &&
     ((edge->rule_ != &State::kPhonyRule ||
      ((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    edge->outputs_ready_ = false;
  }
  edge->mark_ = VisitDone;
  ppNVar11 = (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppNVar11[-1] != local_38) {
    __assert_fail("stack->back() == node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph.cc"
                  ,0xaa,"bool DependencyScan::RecomputeDirty(Node *, vector<Node *> *, string *)");
  }
  (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = ppNVar11 + -1;
  return true;
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* node, vector<Node*>* stack,
                                    string* err) {
  Edge* edge = node->in_edge();
  if (!edge) {
    // If we already visited this leaf node then we are done.
    if (node->status_known())
      return true;
    // This node has no in-edge; it is dirty if it is missing.
    if (!node->StatIfNecessary(disk_interface_, err))
      return false;
    if (!node->exists())
      EXPLAIN("%s has no in-edge and is missing", node->path().c_str());
    node->set_dirty(!node->exists());
    return true;
  }

  // If we already finished this edge then we are done.
  if (edge->mark_ == Edge::VisitDone)
    return true;

  // If we encountered this edge earlier in the call stack we have a cycle.
  if (!VerifyDAG(node, stack, err))
    return false;

  // Mark the edge temporarily while in the call stack.
  edge->mark_ = Edge::VisitInStack;
  stack->push_back(node);

  bool dirty = false;
  edge->outputs_ready_ = true;
  edge->deps_missing_ = false;

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.
    // If there is a pending dyndep file, visit it now:
    // * If the dyndep file is ready then load it now to get any
    //   additional inputs and outputs for this and other edges.
    //   Once the dyndep file is loaded it will no longer be pending
    //   if any other edges encounter it, but they will already have
    //   been updated.
    // * If the dyndep file is not ready then since is known to be an
    //   input to this edge, the edge will not be considered ready below.
    //   Later during the build the dyndep file will become ready and be
    //   loaded to update this edge before it can possibly be scheduled.
    if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
      if (!RecomputeDirty(edge->dyndep_, stack, err))
        return false;

      if (!edge->dyndep_->in_edge() ||
          edge->dyndep_->in_edge()->outputs_ready()) {
        // The dyndep file is ready, so load it now.
        if (!LoadDyndeps(edge->dyndep_, err))
          return false;
      }
    }
  }

  // Load output mtimes so we can compare them to the most recent input below.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!(*o)->StatIfNecessary(disk_interface_, err))
      return false;
  }

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.  Load discovered deps.
    edge->deps_loaded_ = true;
    if (!dep_loader_.LoadDeps(edge, err)) {
      if (!err->empty())
        return false;
      // Failed to load dependency info: rebuild to regenerate it.
      // LoadDeps() did EXPLAIN() already, no need to do it here.
      dirty = edge->deps_missing_ = true;
    }
  }

  // Visit all inputs; we're dirty if any of the inputs are dirty.
  Node* most_recent_input = NULL;
  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    // Visit this input.
    if (!RecomputeDirty(*i, stack, err))
      return false;

    // If an input is not ready, neither are our outputs.
    if (Edge* in_edge = (*i)->in_edge()) {
      if (!in_edge->outputs_ready_)
        edge->outputs_ready_ = false;
    }

    if (!edge->is_order_only(i - edge->inputs_.begin())) {
      // If a regular input is dirty (or missing), we're dirty.
      // Otherwise consider mtime.
      if ((*i)->dirty()) {
        EXPLAIN("%s is dirty", (*i)->path().c_str());
        dirty = true;
      } else {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime()) {
          most_recent_input = *i;
        }
      }
    }
  }

  // We may also be dirty due to output state: missing outputs, out of
  // date outputs, etc.  Visit all outputs and determine whether they're dirty.
  if (!dirty)
    if (!RecomputeOutputsDirty(edge, most_recent_input, &dirty, err))
      return false;

  // Finally, visit each output and update their dirty state if necessary.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (dirty)
      (*o)->MarkDirty();
  }

  // If an edge is dirty, its outputs are normally not ready.  (It's
  // possible to be clean but still not be ready in the presence of
  // order-only inputs.)
  // But phony edges with no inputs have nothing to do, so are always
  // ready.
  if (dirty && !(edge->is_phony() && edge->inputs_.empty()))
    edge->outputs_ready_ = false;

  // Mark the edge as finished during this walk now that it will no longer
  // be in the call stack.
  edge->mark_ = Edge::VisitDone;
  assert(stack->back() == node);
  stack->pop_back();

  return true;
}